

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

void free_desc(memdesc *desc)

{
  memdesc *desc_local;
  
  sanity_freenode(desc);
  LOCK(&descriptors_lock);
  if ((desc->len < hdbg.rememberbigger) || (hdbg.maxbig <= hdbg.numbig)) {
    (desc->node).tqe_next = (memdesc *)0x0;
    (desc->node).tqe_prev = hdbg.descriptors.tqh_last;
    *hdbg.descriptors.tqh_last = desc;
    hdbg.descriptors.tqh_last = (memdesc **)desc;
  }
  else {
    (desc->node).tqe_next = (memdesc *)0x0;
    (desc->node).tqe_prev = hdbg.freebig.tqh_last;
    *hdbg.freebig.tqh_last = desc;
    hdbg.numbig = hdbg.numbig + 1;
    hdbg.freebig.tqh_last = (memdesc **)desc;
  }
  UNLOCK(&descriptors_lock);
  return;
}

Assistant:

static void free_desc(struct memdesc *desc) {
    sanity_freenode(desc);
    LOCK(&descriptors_lock);
    if (desc->len >= hdbg.rememberbigger && hdbg.numbig < hdbg.maxbig) {
       TAILQ_INSERT_TAIL(&hdbg.freebig, desc, node);
       hdbg.numbig++;
    } else {
       TAILQ_INSERT_TAIL(&hdbg.descriptors, desc, node);
    }
    UNLOCK(&descriptors_lock);
}